

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

int show_current_example_proc(Am_Object *self)

{
  Am_Object AVar1;
  byte bVar2;
  ushort uVar3;
  Am_Value *pAVar4;
  ulong uVar5;
  Am_Object *pAVar6;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Object example;
  Am_Object *self_local;
  
  example.data = (Am_Object_Data *)self;
  pAVar4 = (Am_Value *)Am_Object::Get(0x5530,0x169);
  Am_Object::Am_Object(&local_18,pAVar4);
  bVar2 = Am_Object::Valid();
  AVar1 = example;
  if ((bVar2 & 1) != 0) {
    Am_Object::Am_Object(local_30,(Am_Object *)&gesture_shown);
    Am_Object::Remove_Part((Am_Object *)AVar1.data);
    Am_Object::~Am_Object(local_30);
  }
  bVar2 = Am_Object::Valid();
  if ((bVar2 & 1) == 0) {
    Am_Object::operator=(&gesture_shown,(Am_Object_Data *)0x0);
  }
  else {
    Am_Object::Copy((char *)&local_38);
    uVar5 = Am_Object::Get(0x5540,0x66);
    uVar3 = Am_Object::Set((ushort)&local_38,(Am_Value *)0x66,uVar5);
    uVar5 = Am_Object::Get(0x5540,0x67);
    pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Value *)0x67,uVar5);
    Am_Object::operator=(&gesture_shown,pAVar6);
    Am_Object::~Am_Object(&local_38);
    AVar1 = example;
    Am_Object::Am_Object(&local_40,(Am_Object *)&gesture_shown);
    Am_Object::Add_Part((Am_Object *)AVar1.data,SUB81(&local_40,0),1);
    Am_Object::~Am_Object(&local_40);
  }
  Am_Object::~Am_Object(&local_18);
  return 1;
}

Assistant:

Am_Define_Formula(int, show_current_example)
{
  Am_Object example = example_panel.Get(Am_VALUE);

  if (gesture_shown.Valid())
    self.Remove_Part(gesture_shown);

  if (example.Valid()) {
    gesture_shown = example.Copy()
                        .Set(Am_WIDTH, gesture_frame.Get(Am_WIDTH))
                        .Set(Am_HEIGHT, gesture_frame.Get(Am_HEIGHT));
    self.Add_Part(gesture_shown);
  } else
    gesture_shown = nullptr;

  return 1;
}